

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O0

int archive_write_set_passphrase(archive *_a,char *p)

{
  int iVar1;
  archive_vtable_conflict *paVar2;
  int magic_test;
  archive_write *a;
  char *p_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_passphrase");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else if ((p == (char *)0x0) || (*p == '\0')) {
    archive_set_error(_a,-1,"Empty passphrase is unacceptable");
    _a_local._4_4_ = -0x19;
  }
  else {
    free(_a[2].vtable);
    paVar2 = (archive_vtable_conflict *)strdup(p);
    _a[2].vtable = paVar2;
    if (_a[2].vtable == (archive_vtable_conflict *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate data for passphrase");
      _a_local._4_4_ = -0x1e;
    }
    else {
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_passphrase(struct archive *_a, const char *p)
{
	struct archive_write *a = (struct archive_write *)_a;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW,
		"archive_write_set_passphrase");

	if (p == NULL || p[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}
	free(a->passphrase);
	a->passphrase = strdup(p);
	if (a->passphrase == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data for passphrase");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}